

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O1

FxExpression * __thiscall FxLoopStatement::Resolve(FxLoopStatement *this,FCompileContext *ctx)

{
  FxExpression *pFVar1;
  FxLoopStatement *pFVar2;
  int iVar3;
  undefined4 extraout_var;
  
  pFVar1 = ctx->ControlStmt;
  pFVar2 = ctx->Loop;
  ctx->ControlStmt = &this->super_FxExpression;
  ctx->Loop = this;
  iVar3 = (*(this->super_FxExpression)._vptr_FxExpression[0xb])();
  ctx->ControlStmt = pFVar1;
  ctx->Loop = pFVar2;
  return (FxExpression *)CONCAT44(extraout_var,iVar3);
}

Assistant:

FxExpression *FxLoopStatement::Resolve(FCompileContext &ctx)
{
	auto outerctrl = ctx.ControlStmt;
	auto outer = ctx.Loop;
	ctx.ControlStmt = this;
	ctx.Loop = this;
	auto x = DoResolve(ctx);
	ctx.Loop = outer;
	ctx.ControlStmt = outerctrl;
	return x;
}